

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool __thiscall QMainWindowLayoutState::fits(QMainWindowLayoutState *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long in_FS_OFFSET;
  QSize size;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  bool bVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  QDockAreaLayout::minimumStableSize
            ((QDockAreaLayout *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar2 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  piVar4 = QSize::rwidth((QSize *)0x5f36ff);
  *piVar4 = iVar2 + *piVar4;
  iVar2 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  piVar4 = QSize::rwidth((QSize *)0x5f372f);
  *piVar4 = iVar2 + *piVar4;
  iVar2 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  piVar4 = QSize::rheight((QSize *)0x5f375f);
  *piVar4 = iVar2 + *piVar4;
  iVar2 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  piVar4 = QSize::rheight((QSize *)0x5f3792);
  *piVar4 = iVar2 + *piVar4;
  iVar2 = QSize::width((QSize *)0x5f37a4);
  iVar3 = QWidget::width((QWidget *)0x5f37b8);
  bVar5 = false;
  if (iVar2 <= iVar3) {
    iVar2 = QSize::height((QSize *)0x5f37d2);
    iVar3 = QWidget::height((QWidget *)0x5f37e6);
    bVar5 = iVar2 <= iVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutState::fits() const
{
    Q_ASSERT(mainWindow);

    QSize size;

#if QT_CONFIG(dockwidget)
    size = dockAreaLayout.minimumStableSize();
#endif

#if QT_CONFIG(toolbar)
    size.rwidth() += toolBarAreaLayout.docks[QInternal::LeftDock].rect.width();
    size.rwidth() += toolBarAreaLayout.docks[QInternal::RightDock].rect.width();
    size.rheight() += toolBarAreaLayout.docks[QInternal::TopDock].rect.height();
    size.rheight() += toolBarAreaLayout.docks[QInternal::BottomDock].rect.height();
#endif

    return size.width() <= mainWindow->width() && size.height() <= mainWindow->height();
}